

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O1

int XNVCTRLQueryGvoColorConversion
              (Display *dpy,int screen,float (*colorMatrix) [3],float *colorOffset,float *colorScale
              )

{
  int iVar1;
  XExtDisplayInfo *pXVar2;
  undefined1 *puVar3;
  _func_int__XDisplay_ptr *p_Var4;
  xnvCtrlQueryGvoColorConversionReply rep;
  undefined1 local_50 [32];
  
  pXVar2 = find_display(dpy);
  iVar1 = 0;
  if ((pXVar2 != (XExtDisplayInfo *)0x0) && (iVar1 = 0, pXVar2->codes != (XExtCodes *)0x0)) {
    if (dpy->lock_fns != (_XLockPtrs *)0x0) {
      (*dpy->lock_fns->lock_display)(dpy);
    }
    puVar3 = (undefined1 *)_XGetRequest(dpy,0x16,8);
    *puVar3 = (char)pXVar2->codes->major_opcode;
    puVar3[1] = 0x16;
    *(int *)(puVar3 + 4) = screen;
    iVar1 = _XReply(dpy,local_50,0,0);
    if (iVar1 == 0) {
      if (dpy->lock_fns != (_XLockPtrs *)0x0) {
        (*dpy->lock_fns->unlock_display)(dpy);
      }
      p_Var4 = dpy->synchandler;
      iVar1 = 0;
    }
    else {
      _XRead(dpy,colorMatrix,0x24);
      _XRead(dpy,colorOffset,0xc);
      _XRead(dpy,colorScale,0xc);
      if (dpy->lock_fns != (_XLockPtrs *)0x0) {
        (*dpy->lock_fns->unlock_display)(dpy);
      }
      p_Var4 = dpy->synchandler;
      iVar1 = 1;
    }
    if (p_Var4 != (_func_int__XDisplay_ptr *)0x0) {
      (*p_Var4)(dpy);
    }
  }
  return iVar1;
}

Assistant:

Bool XNVCTRLQueryGvoColorConversion (
    Display *dpy,
    int screen,
    float colorMatrix[3][3],
    float colorOffset[3],
    float colorScale[3]
){
    XExtDisplayInfo *info = find_display (dpy);
    xnvCtrlQueryGvoColorConversionReply rep;
    xnvCtrlQueryGvoColorConversionReq *req;
    
    if(!XextHasExtension(info))
        return False;

    XNVCTRLCheckExtension (dpy, info, False);

    LockDisplay (dpy);

    GetReq (nvCtrlQueryGvoColorConversion, req);
    req->reqType = info->codes->major_opcode;
    req->nvReqType = X_nvCtrlQueryGvoColorConversion;
    req->screen = screen;

    if (!_XReply(dpy, (xReply *) &rep, 0, xFalse)) {
        UnlockDisplay (dpy);
        SyncHandle ();
        return False;
    }

    _XRead(dpy, (char *)(colorMatrix), 36);
    _XRead(dpy, (char *)(colorOffset), 12);
    _XRead(dpy, (char *)(colorScale), 12);

    UnlockDisplay (dpy);
    SyncHandle ();

    return True;
}